

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abin.c
# Opt level: O2

atomBins * initBins(char serialNum,region *boundingBox,float delta)

{
  int iVar1;
  atomBins *b;
  atomPtr ***__ptr;
  atomPtr **__ptr_00;
  atomPtr *__ptr_01;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  uint uVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (delta < 0.1) {
    delta = 5.0;
  }
  auVar14._0_8_ = (double)delta;
  dVar10 = floor(((boundingBox->max).z - (boundingBox->min).z) / auVar14._0_8_ + 1.0);
  uVar7 = (uint)(dVar10 + 2.0);
  b = (atomBins *)malloc(0x68);
  b->delta = delta;
  auVar12._0_8_ = (boundingBox->max).x - (boundingBox->min).x;
  auVar12._8_8_ = (boundingBox->max).y - (boundingBox->min).y;
  auVar14._8_8_ = auVar14._0_8_;
  auVar12 = divpd(auVar12,auVar14);
  dVar10 = floor(auVar12._0_8_ + 1.0);
  dVar11 = floor(auVar12._8_8_ + 1.0);
  uVar9 = (uint)(dVar10 + 2.0);
  uVar13 = (uint)(dVar11 + 2.0);
  (b->min).z = (boundingBox->min).z;
  dVar10 = (boundingBox->min).y;
  (b->min).x = (boundingBox->min).x;
  (b->min).y = dVar10;
  (b->max).z = (boundingBox->max).z;
  dVar10 = (boundingBox->max).y;
  (b->max).x = (boundingBox->max).x;
  (b->max).y = dVar10;
  v3sub(&b->max,(vector3d *)b,&b->sz);
  b->nx = uVar9;
  b->ny = uVar13;
  b->nz = uVar7;
  b->binSerialNum = serialNum;
  __ptr = (atomPtr ***)malloc((long)(int)uVar9 << 3);
  __ptr_00 = (atomPtr **)malloc((long)(int)(uVar13 * uVar9) << 3);
  __ptr_01 = (atomPtr *)malloc((long)(int)(uVar13 * uVar9 * uVar7) << 3);
  auVar15._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
  auVar15._4_4_ = -(uint)((int)__ptr == 0 && (int)((ulong)__ptr >> 0x20) == 0);
  auVar15._8_4_ = -(uint)((int)((ulong)__ptr_00 >> 0x20) == 0 && (int)__ptr_00 == 0);
  auVar15._12_4_ = -(uint)((int)__ptr_01 == 0 && (int)((ulong)__ptr_01 >> 0x20) == 0);
  iVar1 = movmskps((int)__ptr_01,auVar15);
  if (iVar1 == 0) {
    uVar2 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar2;
    }
    uVar6 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar6 = uVar2;
    }
    b->list = __ptr;
    uVar3 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar3 = uVar2;
    }
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      b->list[uVar2] = __ptr_00;
      for (uVar4 = 0; uVar4 != uVar6; uVar4 = uVar4 + 1) {
        b->list[uVar2][uVar4] = __ptr_01;
        for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
          b->list[uVar2][uVar4][uVar5] = (atomPtr)0x0;
        }
        __ptr_01 = __ptr_01 + (int)uVar7;
      }
      __ptr_00 = __ptr_00 + (int)uVar13;
    }
  }
  else {
    warn("could not create atom bins");
    free(b);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    b = (atomBins *)0x0;
  }
  return b;
}

Assistant:

atomBins* initBins(char serialNum, region *boundingBox, float delta) {
	atomBins *bp;
	int i, j, k, nx, ny, nz;
	int n1, n2, n3;
	atomPtr ***b1, **b2, *b3;

	if (delta < 0.1) delta = 5.0;

	nx = OFFSET(boundingBox->max.x, boundingBox->min.x, delta) + 2;
	ny = OFFSET(boundingBox->max.y, boundingBox->min.y, delta) + 2;
	nz = OFFSET(boundingBox->max.z, boundingBox->min.z, delta) + 2;

	bp = (atomBins *)malloc(sizeof(atomBins));

	bp->delta = delta;

	bp->min = boundingBox->min;
	bp->max = boundingBox->max;
	v3sub(&(bp->max), &(bp->min), &(bp->sz));
	bp->nx = nx;
	bp->ny = ny;
	bp->nz = nz;
	bp->binSerialNum = serialNum;

	n1 = nx;
	n2 = nx*ny;
	n3 = nx*ny*nz;

	b1 = (atomPtr ***)malloc(sizeof(atomPtr **)*n1);
	b2 = (atomPtr  **)malloc(sizeof(atomPtr  *)*n2);
	b3 = (atomPtr   *)malloc(sizeof(atomPtr   )*n3);
	if (!bp || !b1 || !b2 || !b3) {
		warn("could not create atom bins");
		if (bp) free(bp);
		if (b1) free(b1);
		if (b2) free(b2);
		if (b3) free(b3);
		return NULL;
	}

	bp->list = b1;

	for(i = 0; i < nx; i++) {
		bp->list[i] = b2; b2 += ny;

		for(j = 0; j < ny; j++) {
			bp->list[i][j] = b3; b3 += nz;

			for(k = 0; k < nz; k++) {
				bp->list[i][j][k] = 0;
			}
		}
	}

	return bp;
}